

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O2

Preprocessor *
preprocessor_start(char *fname,char *source,uint sourcelen,MOJOSHADER_includeOpen open_callback,
                  MOJOSHADER_includeClose close_callback,MOJOSHADER_preprocessorDefine *defines,
                  uint define_count,int asm_comments,MOJOSHADER_malloc m,MOJOSHADER_free f,void *d)

{
  int iVar1;
  Context_conflict1 *ctx;
  StringCache *pSVar2;
  Define *pDVar3;
  char *pcVar4;
  Buffer *buffer;
  size_t sVar5;
  ulong uVar6;
  uint srclen;
  char **ppcVar7;
  bool bVar8;
  
  if (m == (MOJOSHADER_malloc)0x0) {
    __assert_fail("m != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x26b,
                  "Preprocessor *preprocessor_start(const char *, const char *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose, const MOJOSHADER_preprocessorDefine *, unsigned int, int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                 );
  }
  if (f == (MOJOSHADER_free)0x0) {
    __assert_fail("f != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                  ,0x26c,
                  "Preprocessor *preprocessor_start(const char *, const char *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose, const MOJOSHADER_preprocessorDefine *, unsigned int, int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                 );
  }
  ctx = (Context_conflict1 *)(*m)(0x978,d);
  if (ctx == (Context_conflict1 *)0x0) {
    return (Preprocessor *)0x0;
  }
  bVar8 = false;
  memset(ctx,0,0x950);
  ctx->malloc = m;
  ctx->free = f;
  ctx->malloc_data = d;
  ctx->open_callback = open_callback;
  ctx->close_callback = close_callback;
  ctx->asm_comments = asm_comments;
  pSVar2 = stringcache_create(MallocBridge,FreeBridge,ctx);
  ctx->filename_cache = pSVar2;
  pDVar3 = get_define(ctx);
  ctx->file_macro = pDVar3;
  if (pDVar3 != (Define *)0x0 && pSVar2 != (StringCache *)0x0) {
    pcVar4 = StrDup(ctx,"__FILE__");
    ctx->file_macro->identifier = pcVar4;
    bVar8 = pcVar4 != (char *)0x0;
  }
  pDVar3 = get_define(ctx);
  ctx->line_macro = pDVar3;
  if (bVar8 && pDVar3 != (Define *)0x0) {
    pcVar4 = StrDup(ctx,"__LINE__");
    ctx->line_macro->identifier = pcVar4;
    if (define_count == 0 || pcVar4 == (char *)0x0) {
      if (pcVar4 == (char *)0x0) goto LAB_00131b9d;
      srclen = 0;
      pcVar4 = (char *)0x0;
    }
    else {
      buffer = buffer_create(0x100,MallocBridge,FreeBridge,ctx);
      bVar8 = buffer != (Buffer *)0x0;
      ppcVar7 = &defines->definition;
      for (uVar6 = 0; (bVar8 && (uVar6 < define_count)); uVar6 = uVar6 + 1) {
        iVar1 = buffer_append_fmt(buffer,"#define %s %s\n",
                                  ((MOJOSHADER_preprocessorDefine *)(ppcVar7 + -1))->identifier,
                                  *ppcVar7);
        bVar8 = iVar1 != 0;
        ppcVar7 = ppcVar7 + 2;
      }
      sVar5 = buffer_size(buffer);
      srclen = (uint)sVar5;
      if (srclen == 0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar4 = buffer_flatten(buffer);
        bVar8 = (bool)(bVar8 & pcVar4 != (char *)0x0);
      }
      buffer_destroy(buffer);
      if (!bVar8) goto LAB_00131b9d;
    }
    iVar1 = push_source(ctx,fname,source,sourcelen,1,(MOJOSHADER_includeClose)0x0);
    if (srclen != 0 && iVar1 != 0) {
      if (pcVar4 == (char *)0x0) {
        __assert_fail("define_include != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/andburn[P]mojoshader/mojoshader_preprocessor.c"
                      ,0x2a2,
                      "Preprocessor *preprocessor_start(const char *, const char *, unsigned int, MOJOSHADER_includeOpen, MOJOSHADER_includeClose, const MOJOSHADER_preprocessorDefine *, unsigned int, int, MOJOSHADER_malloc, MOJOSHADER_free, void *)"
                     );
      }
      iVar1 = push_source(ctx,"<predefined macros>",pcVar4,srclen,1,close_define_include);
    }
    if (iVar1 != 0) {
      return (Preprocessor *)ctx;
    }
  }
LAB_00131b9d:
  preprocessor_end((Preprocessor *)ctx);
  return (Preprocessor *)0x0;
}

Assistant:

Preprocessor *preprocessor_start(const char *fname, const char *source,
                            unsigned int sourcelen,
                            MOJOSHADER_includeOpen open_callback,
                            MOJOSHADER_includeClose close_callback,
                            const MOJOSHADER_preprocessorDefine *defines,
                            unsigned int define_count, int asm_comments,
                            MOJOSHADER_malloc m, MOJOSHADER_free f, void *d)
{
    int okay = 1;
    unsigned int i = 0;

    // the preprocessor is internal-only, so we verify all these are != NULL.
    assert(m != NULL);
    assert(f != NULL);

    Context *ctx = (Context *) m(sizeof (Context), d);
    if (ctx == NULL)
        return NULL;

    memset(ctx, '\0', sizeof (Context));
    ctx->malloc = m;
    ctx->free = f;
    ctx->malloc_data = d;
    ctx->open_callback = open_callback;
    ctx->close_callback = close_callback;
    ctx->asm_comments = asm_comments;

    ctx->filename_cache = stringcache_create(MallocBridge, FreeBridge, ctx);
    okay = ((okay) && (ctx->filename_cache != NULL));

    ctx->file_macro = get_define(ctx);
    okay = ((okay) && (ctx->file_macro != NULL));
    if ((okay) && (ctx->file_macro))
        okay = ((ctx->file_macro->identifier = StrDup(ctx, "__FILE__")) != 0);

    ctx->line_macro = get_define(ctx);
    okay = ((okay) && (ctx->line_macro != NULL));
    if ((okay) && (ctx->line_macro))
        okay = ((ctx->line_macro->identifier = StrDup(ctx, "__LINE__")) != 0);

    // let the usual preprocessor parser sort these out.
    char *define_include = NULL;
    unsigned int define_include_len = 0;
    if ((okay) && (define_count > 0))
    {
        Buffer *predefbuf = buffer_create(256, MallocBridge, FreeBridge, ctx);
        okay = okay && (predefbuf != NULL);
        for (i = 0; okay && (i < define_count); i++)
        {
            okay = okay && buffer_append_fmt(predefbuf, "#define %s %s\n",
                                 defines[i].identifier, defines[i].definition);
        } // for

        define_include_len = buffer_size(predefbuf);
        if (define_include_len > 0)
        {
            define_include = buffer_flatten(predefbuf);
            okay = okay && (define_include != NULL);
        } // if
        buffer_destroy(predefbuf);
    } // if

    if ((okay) && (!push_source(ctx,fname,source,sourcelen,1,NULL)))
        okay = 0;

    if ((okay) && (define_include_len > 0))
    {
        assert(define_include != NULL);
        okay = push_source(ctx, "<predefined macros>", define_include,
                           define_include_len, 1, close_define_include);
    } // if

    if (!okay)
    {
        preprocessor_end((Preprocessor *) ctx);
        return NULL;
    } // if

    return (Preprocessor *) ctx;
}